

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCppFile.h
# Opt level: O2

void __thiscall cppforth::Forth::fileStatus(Forth *this)

{
  ForthStack<unsigned_int> *this_00;
  bool bVar1;
  uint uVar2;
  uint uVar3;
  string filename;
  path local_40;
  
  requireDStackDepth(this,2,"OPEN-FILE");
  this_00 = &this->dStack;
  uVar2 = ForthStack<unsigned_int>::getTop(this_00,1);
  uVar3 = ForthStack<unsigned_int>::getTop(this_00);
  filename._M_dataplus._M_p = (pointer)&filename.field_2;
  filename._M_string_length = 0;
  filename.field_2._M_local_buf[0] = '\0';
  moveFromDataSpace(this,&filename,uVar2,(ulong)uVar3);
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            (&local_40,&filename,auto_format);
  bVar1 = std::filesystem::exists(&local_40);
  std::filesystem::__cxx11::path::~path(&local_40);
  ForthStack<unsigned_int>::setTop(this_00,1,0);
  uVar2 = 0xffffffbd;
  if (bVar1) {
    uVar2 = 0;
  }
  ForthStack<unsigned_int>::setTop(this_00,uVar2);
  std::__cxx11::string::~string((string *)&filename);
  return;
}

Assistant:

void fileStatus() {
	REQUIRE_DSTACK_DEPTH(2, "OPEN-FILE");

	auto caddr = dStack.getTop(1);
	auto length = SIZE_T(dStack.getTop());
	
	std::string filename{};
	moveFromDataSpace(filename, caddr, length);
	auto exists = std::filesystem::exists(filename);
	dStack.setTop(1, 0);
	dStack.setTop(exists? 0: errorFileStatus );
}